

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resources.cpp
# Opt level: O2

shared_ptr<PolledFile> __thiscall Resources::getFile(Resources *this,string *filename)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>_>
  *this_00;
  iterator iVar1;
  PolledFile *this_01;
  __shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2> *this_02;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<PolledFile> sVar3;
  string_view filename_00;
  string local_d0;
  path local_b0;
  path local_70;
  
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>_>
             *)((long)&filename[3].field_2 + 8);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>_>
          ::find(this_00,in_RDX);
  if (iVar1._M_node == (_Base_ptr)(filename + 4)) {
    this_01 = (PolledFile *)operator_new(0x10);
    std::experimental::filesystem::v1::__cxx11::path::
    path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_b0,in_RDX);
    std::experimental::filesystem::v1::__cxx11::operator/(&local_70,(path *)filename,&local_b0);
    std::experimental::filesystem::v1::__cxx11::path::string(&local_d0,&local_70);
    filename_00._M_str = local_d0._M_dataplus._M_p;
    filename_00._M_len = local_d0._M_string_length;
    PolledFile::PolledFile(this_01,filename_00);
    std::__shared_ptr<PolledFile,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<PolledFile,void>
              ((__shared_ptr<PolledFile,(__gnu_cxx::_Lock_policy)2> *)this,this_01);
    std::__cxx11::string::~string((string *)&local_d0);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_70);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_b0);
    this_02 = &std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>_>
                             *)this_00,in_RDX)->
               super___shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_02,(__shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2> *)this);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    std::__shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2> *)(iVar1._M_node + 2));
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<PolledFile>)sVar3.super___shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<PolledFile> Resources::getFile(const std::string &filename) {
	const auto it = files_.find(filename);
	if (it != files_.end())
		return it->second;

	auto file = std::shared_ptr<PolledFile>(new PolledFile((project_root_/filename).string()));
	files_[filename] = file;
	return file;
}